

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void xatlas::internal::insertionSort<unsigned_int>(uint *data,uint32_t length)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int local_20;
  int32_t j;
  uint x;
  int32_t i;
  uint32_t length_local;
  uint *data_local;
  
  for (j = 1; j < (int)length; j = j + 1) {
    uVar1 = data[j];
    iVar2 = j;
    while( true ) {
      local_20 = iVar2 + -1;
      bVar3 = false;
      if (-1 < local_20) {
        bVar3 = uVar1 < data[local_20];
      }
      if (!bVar3) break;
      data[iVar2] = data[local_20];
      iVar2 = local_20;
    }
    data[iVar2] = uVar1;
  }
  return;
}

Assistant:

static void insertionSort(T *data, uint32_t length)
{
	for (int32_t i = 1; i < (int32_t)length; i++) {
		T x = data[i];
		int32_t j = i - 1;
		while (j >= 0 && x < data[j]) {
			data[j + 1] = data[j];
			j--;
		}
		data[j + 1] = x;
	}
}